

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

int format_octal(int64_t v,char *p,int s)

{
  char *__src;
  bool local_31;
  char *h;
  int len;
  int s_local;
  char *p_local;
  int64_t v_local;
  
  h._0_4_ = s;
  _len = p;
  if (v < 0) {
    while (0 < (int)h) {
      *_len = '0';
      h._0_4_ = (int)h + -1;
      _len = _len + 1;
    }
    v_local._4_4_ = -1;
  }
  else {
    h._4_4_ = s;
    _len = p + s;
    p_local = (char *)v;
    do {
      __src = _len + -1;
      _len[-1] = ((byte)p_local & 7) + 0x30;
      p_local = (char *)((long)p_local >> 3);
      h._4_4_ = h._4_4_ + -1;
      local_31 = 0 < h._4_4_ && 0 < (long)p_local;
      _len = __src;
    } while (local_31);
    if (p_local == (char *)0x0) {
      memmove(p,__src,(long)(s - h._4_4_));
      _len = p + ((long)s - (long)h._4_4_);
      while (0 < h._4_4_) {
        *_len = ' ';
        h._4_4_ = h._4_4_ + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = 0;
    }
    else {
      while (0 < (int)h) {
        *_len = '7';
        h._0_4_ = (int)h + -1;
        _len = _len + 1;
      }
      v_local._4_4_ = -1;
    }
  }
  return v_local._4_4_;
}

Assistant:

static int
format_octal(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 3)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_octal_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_octal_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}